

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter_impl.h
# Opt level: O2

void __thiscall
spdlog::details::full_formatter::format(full_formatter *this,log_msg *msg,tm *tm_time)

{
  MemoryWriter *this_00;
  char *__s;
  Buffer<char> *pBVar1;
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  BasicWriter<char> *pBVar2;
  size_t sVar3;
  long lVar4;
  IntFormatSpec<unsigned_int,_fmt::AlignTypeSpec<__x00_>,_char> spec;
  IntFormatSpec<unsigned_int,_fmt::AlignTypeSpec<__x00_>,_char> spec_00;
  IntFormatSpec<unsigned_int,_fmt::AlignTypeSpec<__x00_>,_char> spec_01;
  IntFormatSpec<unsigned_int,_fmt::AlignTypeSpec<__x00_>,_char> spec_02;
  IntFormatSpec<unsigned_int,_fmt::AlignTypeSpec<__x00_>,_char> spec_03;
  IntFormatSpec<unsigned_int,_fmt::AlignTypeSpec<__x00_>,_char> spec_04;
  BasicStringRef<char> value_01;
  BasicStringRef<char> value_02;
  BasicStringRef<char> value_03;
  BasicStringRef<char> value_04;
  
  lVar4 = (msg->time).__d.__r;
  this_00 = &msg->formatted;
  pBVar2 = fmt::BasicWriter<char>::operator<<(&this_00->super_BasicWriter<char>,'[');
  pBVar2 = fmt::BasicWriter<char>::operator<<
                     (pBVar2,(IntFormatSpec<unsigned_int,_fmt::TypeSpec<__x00_>,_char>)
                             (tm_time->tm_year + 0x76c));
  pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,'-');
  spec._8_8_ = (ulong)(tm_time->tm_mon + 1) << 0x20;
  spec.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.width_ = 2;
  spec.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.fill_ = L'0';
  pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,spec);
  pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,'-');
  spec_00._8_8_ = (ulong)(uint)tm_time->tm_mday << 0x20;
  spec_00.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.width_ = 2;
  spec_00.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.fill_ = L'0';
  pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,spec_00);
  pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,' ');
  spec_01._8_8_ = (ulong)(uint)tm_time->tm_hour << 0x20;
  spec_01.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.width_ = 2;
  spec_01.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.fill_ = L'0';
  pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,spec_01);
  pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,':');
  spec_02._8_8_ = (ulong)(uint)tm_time->tm_min << 0x20;
  spec_02.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.width_ = 2;
  spec_02.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.fill_ = L'0';
  pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,spec_02);
  pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,':');
  spec_03._8_8_ = (ulong)(uint)tm_time->tm_sec << 0x20;
  spec_03.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.width_ = 2;
  spec_03.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.fill_ = L'0';
  pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,spec_03);
  pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,'.');
  lVar4 = (lVar4 / 1000000) % 1000 << 0x20;
  spec_04.super_AlignTypeSpec<__x00_>.super_AlignSpec.align_ = (int)lVar4;
  spec_04.value_ = (int)((ulong)lVar4 >> 0x20);
  spec_04.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.width_ = 3;
  spec_04.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.fill_ = L'0';
  pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,spec_04);
  value_01.size_ = 2;
  value_01.data_ = "] ";
  fmt::BasicWriter<char>::operator<<(pBVar2,value_01);
  pBVar2 = fmt::BasicWriter<char>::operator<<(&this_00->super_BasicWriter<char>,'[');
  value.data_ = (msg->logger_name->_M_dataplus)._M_p;
  value.size_ = msg->logger_name->_M_string_length;
  pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,value);
  value_02.size_ = 2;
  value_02.data_ = "] ";
  fmt::BasicWriter<char>::operator<<(pBVar2,value_02);
  fmt::BasicWriter<char>::operator<<(&this_00->super_BasicWriter<char>,'[');
  msg->color_range_start = ((msg->formatted).super_BasicWriter<char>.buffer_)->size_;
  __s = *(char **)(level::level_names + (ulong)msg->level * 8);
  sVar3 = strlen(__s);
  value_03.size_ = sVar3;
  value_03.data_ = __s;
  fmt::BasicWriter<char>::operator<<(&this_00->super_BasicWriter<char>,value_03);
  msg->color_range_end = ((msg->formatted).super_BasicWriter<char>.buffer_)->size_;
  value_04.size_ = 2;
  value_04.data_ = "] ";
  pBVar2 = fmt::BasicWriter<char>::operator<<(&this_00->super_BasicWriter<char>,value_04);
  pBVar1 = (msg->raw).super_BasicWriter<char>.buffer_;
  value_00.data_ = pBVar1->ptr_;
  value_00.size_ = pBVar1->size_;
  fmt::BasicWriter<char>::operator<<(pBVar2,value_00);
  return;
}

Assistant:

void format(details::log_msg &msg, const std::tm &tm_time) override
    {
#ifndef SPDLOG_NO_DATETIME
        auto duration = msg.time.time_since_epoch();
        auto millis = std::chrono::duration_cast<std::chrono::milliseconds>(duration).count() % 1000;

        /* Slower version(while still very fast - about 3.2 million lines/sec under 10 threads),
        msg.formatted.write("[{:d}-{:02d}-{:02d} {:02d}:{:02d}:{:02d}.{:03d}] [{}] [{}] {} ",
        tm_time.tm_year + 1900,
        tm_time.tm_mon + 1,
        tm_time.tm_mday,
        tm_time.tm_hour,
        tm_time.tm_min,
        tm_time.tm_sec,
        static_cast<int>(millis),
        msg.logger_name,
        level::to_str(msg.level),
        msg.raw.str());*/

        // Faster (albeit uglier) way to format the line (5.6 million lines/sec under 10 threads)
        msg.formatted << '[' << static_cast<unsigned int>(tm_time.tm_year + 1900) << '-'
                      << fmt::pad(static_cast<unsigned int>(tm_time.tm_mon + 1), 2, '0') << '-'
                      << fmt::pad(static_cast<unsigned int>(tm_time.tm_mday), 2, '0') << ' '
                      << fmt::pad(static_cast<unsigned int>(tm_time.tm_hour), 2, '0') << ':'
                      << fmt::pad(static_cast<unsigned int>(tm_time.tm_min), 2, '0') << ':'
                      << fmt::pad(static_cast<unsigned int>(tm_time.tm_sec), 2, '0') << '.'
                      << fmt::pad(static_cast<unsigned int>(millis), 3, '0') << "] ";

        // no datetime needed
#else
        (void)tm_time;
#endif

#ifndef SPDLOG_NO_NAME
        msg.formatted << '[' << *msg.logger_name << "] ";
#endif

        msg.formatted << '[';
        // wrap the level name with color
        msg.color_range_start = msg.formatted.size();
        msg.formatted << level::to_str(msg.level);
        msg.color_range_end = msg.formatted.size();
        msg.formatted << "] " << fmt::StringRef(msg.raw.data(), msg.raw.size());
    }